

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall wasm::PrintSExpression::visitFunction(PrintSExpression *this,Function *curr)

{
  bool bVar1;
  Function *curr_local;
  PrintSExpression *this_local;
  
  bVar1 = Importable::imported(&curr->super_Importable);
  if (bVar1) {
    visitImportedFunction(this,curr);
  }
  else if (curr->body != (Expression *)0x0) {
    visitDefinedFunction(this,curr);
  }
  return;
}

Assistant:

void PrintSExpression::visitFunction(Function* curr) {
  if (curr->imported()) {
    visitImportedFunction(curr);
  } else if (curr->body == nullptr) {
    // We are in the middle of parsing the module and have not parsed this
    // function's code yet. Skip it.
  } else {
    visitDefinedFunction(curr);
  }
}